

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test::TestBody
          (PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test *this)

{
  __node_base_ptr *this_00;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  pointer this_01;
  char *pcVar4;
  const_reference pvVar5;
  string *val;
  Message *message;
  AssertHelper local_428;
  Message local_420;
  StatusCode local_418;
  StatusCode local_414;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_5;
  VerifyError error;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_4;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_3;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  Message local_368;
  size_type local_360;
  uint local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_1;
  CertPathBuilderResultPath *path;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2e8;
  Message local_2e0;
  size_type local_2d8;
  uint local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_;
  Result result;
  undefined1 local_230 [8];
  CertPathBuilder path_builder;
  undefined1 local_180 [8];
  CertIssuerSourceStatic sync_certs;
  shared_ptr<const_bssl::ParsedCertificate> local_130;
  undefined1 local_120 [8];
  TrustStoreInMemory trust_store2;
  undefined1 local_a0 [8];
  TrustStoreInMemory trust_store1;
  TrustStoreCollection trust_store_collection;
  PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test *this_local;
  
  TrustStoreCollection::TrustStoreCollection
            ((TrustStoreCollection *)
             &trust_store1.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_a0);
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_120);
  TrustStoreCollection::AddTrustStore
            ((TrustStoreCollection *)
             &trust_store1.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (TrustStore *)local_a0);
  TrustStoreCollection::AddTrustStore
            ((TrustStoreCollection *)
             &trust_store1.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (TrustStore *)local_120);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            (&local_130,&(this->super_PathBuilderKeyRolloverTest).newroot_);
  TrustStoreInMemory::AddTrustAnchor((TrustStoreInMemory *)local_a0,&local_130);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_130);
  this_00 = &sync_certs.intermediates_._M_h._M_single_bucket;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)this_00,
             &(this->super_PathBuilderKeyRolloverTest).oldroot_);
  TrustStoreInMemory::AddTrustAnchor
            ((TrustStoreInMemory *)local_120,(shared_ptr<const_bssl::ParsedCertificate> *)this_00);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)
             &sync_certs.intermediates_._M_h._M_single_bucket);
  CertIssuerSourceStatic::CertIssuerSourceStatic((CertIssuerSourceStatic *)local_180);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_,
             &(this->super_PathBuilderKeyRolloverTest).oldintermediate_);
  CertIssuerSourceStatic::AddCert
            ((CertIssuerSourceStatic *)local_180,
             (shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&path_builder.valid_path_count_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             &(this->super_PathBuilderKeyRolloverTest).target_);
  pcVar4 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            ((CertPathBuilder *)local_230,
             (shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             (TrustStore *)
             &trust_store1.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit);
  CertPathBuilder::AddCertIssuerSource((CertPathBuilder *)local_230,(CertIssuerSource *)local_180);
  CertPathBuilder::Run((Result *)&gtest_ar_.message_,(CertPathBuilder *)local_230);
  local_281 = CertPathBuilder::Result::HasValidPath((Result *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_280,
               (AssertionResult *)"result.HasValidPath()","false","true",pcVar4);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x524,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2cc = 1;
  local_2d8 = ::std::
              vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
              ::size((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                      *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_2c8,"1U","result.paths.size()",&local_2cc,&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x525,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(&local_2e0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar3 = ::std::
             vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                           *)&gtest_ar_.message_,
                          (size_type)
                          result.paths.
                          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = ::std::
              unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
              ::operator->(pvVar3);
    local_301 = CertPathBuilderResultPath::IsValid(this_01);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_300,&local_301,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&path,(internal *)local_300,
                 (AssertionResult *)"result.paths[result.best_result_index]->IsValid()","false",
                 "true",pcVar4);
      pcVar4 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x52a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      ::std::__cxx11::string::~string((string *)&path);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    pvVar3 = ::std::
             vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                           *)&gtest_ar_.message_,
                          (size_type)
                          result.paths.
                          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )::std::
           unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           ::operator*(pvVar3);
    local_354 = 3;
    local_360 = ::std::
                vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        *)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_350,"3U","path.certs.size()",&local_354,&local_360);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x52c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_368);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pvVar5 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,0);
      testing::internal::EqHelper::
      Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                ((EqHelper *)local_380,"target_","path.certs[0]",
                 &(this->super_PathBuilderKeyRolloverTest).target_,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
      if (!bVar1) {
        testing::Message::Message(&local_388);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52d,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_388);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_388);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
      pvVar5 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,1);
      testing::internal::EqHelper::
      Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                ((EqHelper *)local_3a0,"oldintermediate_","path.certs[1]",
                 &(this->super_PathBuilderKeyRolloverTest).oldintermediate_,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
      if (!bVar1) {
        testing::Message::Message(&local_3a8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52e,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_3a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
      pvVar5 = ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,2);
      testing::internal::EqHelper::
      Compare<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>,_nullptr>
                ((EqHelper *)local_3c0,"oldroot_","path.certs[2]",
                 &(this->super_PathBuilderKeyRolloverTest).oldroot_,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
      if (!bVar1) {
        testing::Message::Message(&local_3c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52f,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),&local_3c8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8));
        testing::Message::~Message(&local_3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
      CertPathBuilder::Result::GetBestPathVerifyError
                ((VerifyError *)&gtest_ar_5.message_,(Result *)&gtest_ar_.message_);
      local_414 = VerifyError::Code((VerifyError *)&gtest_ar_5.message_);
      local_418 = PATH_VERIFIED;
      testing::internal::EqHelper::
      Compare<bssl::VerifyError::StatusCode,_bssl::VerifyError::StatusCode,_nullptr>
                ((EqHelper *)local_410,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                 &local_414,&local_418);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
      if (!bVar1) {
        testing::Message::Message(&local_420);
        val = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)&gtest_ar_5.message_);
        message = testing::Message::operator<<(&local_420,val);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
        testing::internal::AssertHelper::AssertHelper
                  (&local_428,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x532,pcVar4);
        testing::internal::AssertHelper::operator=(&local_428,message);
        testing::internal::AssertHelper::~AssertHelper(&local_428);
        testing::Message::~Message(&local_420);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      VerifyError::~VerifyError((VerifyError *)&gtest_ar_5.message_);
    }
  }
  CertPathBuilder::Result::~Result((Result *)&gtest_ar_.message_);
  CertPathBuilder::~CertPathBuilder((CertPathBuilder *)local_230);
  CertIssuerSourceStatic::~CertIssuerSourceStatic((CertIssuerSourceStatic *)local_180);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_120);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_a0);
  TrustStoreCollection::~TrustStoreCollection
            ((TrustStoreCollection *)
             &trust_store1.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestMultipleRootMatchesOnlyOneWorks) {
  TrustStoreCollection trust_store_collection;
  TrustStoreInMemory trust_store1;
  TrustStoreInMemory trust_store2;
  trust_store_collection.AddTrustStore(&trust_store1);
  trust_store_collection.AddTrustStore(&trust_store2);
  // Add two trust anchors (newroot_ and oldroot_). Path building will attempt
  // them in this same order, as trust_store1 was added to
  // trust_store_collection first.
  trust_store1.AddTrustAnchor(newroot_);
  trust_store2.AddTrustAnchor(oldroot_);

  // Only oldintermediate is supplied, so the path with newroot should fail,
  // oldroot should succeed.
  CertIssuerSourceStatic sync_certs;
  sync_certs.AddCert(oldintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store_collection, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(1U, result.paths.size());

  // Due to authorityKeyIdentifier prioritization, path builder will first
  // attempt: target <- old intermediate <- oldroot
  // which should succeed.
  EXPECT_TRUE(result.paths[result.best_result_index]->IsValid());
  const auto &path = *result.paths[result.best_result_index];
  ASSERT_EQ(3U, path.certs.size());
  EXPECT_EQ(target_, path.certs[0]);
  EXPECT_EQ(oldintermediate_, path.certs[1]);
  EXPECT_EQ(oldroot_, path.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}